

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::ArchiveIN(ChBody *this,ChArchiveIn *marchive)

{
  element_type *peVar1;
  pointer psVar2;
  ChArchiveIn *this_00;
  pointer psVar3;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool mflag;
  shared_ptr<chrono::ChMarker> i;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  tempforces;
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  tempmarkers;
  bool local_2a9;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> local_2a8;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  local_298;
  ChArchiveIn *local_280;
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  local_278;
  __shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> local_260;
  __shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2> local_250;
  ChNameValue<float> local_240;
  ChNameValue<float> local_228;
  ChNameValue<float> local_210;
  ChNameValue<float> local_1f8;
  ChNameValue<float> local_1e0;
  ChNameValue<float> local_1c8;
  ChNameValue<chrono::ChVariablesBodyOwnMass> local_1b0;
  ChNameValue<float> local_198;
  ChNameValue<chrono::ChVector<double>_> local_180;
  ChNameValue<chrono::ChVector<double>_> local_168;
  ChNameValue<chrono::ChVector<double>_> local_150;
  ChNameValue<std::shared_ptr<chrono::collision::ChCollisionModel>_> local_138;
  ChNameValue<unsigned_int> local_120;
  ChNameValue<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
  local_108;
  ChNameValue<std::vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>_>
  local_f0;
  ChNameValue<bool> local_d8;
  ChNameValue<bool> local_c0;
  ChNameValue<bool> local_a8;
  ChNameValue<bool> local_90;
  ChNameValue<bool> local_78;
  ChNameValue<bool> local_60;
  ChNameValue<int> local_48;
  
  ChArchiveIn::VersionRead<chrono::ChBody>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  ChBodyFrame::ArchiveIN(&this->super_ChBodyFrame,marchive);
  local_48._value = &this->bflags;
  local_48._name = "bflags";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._name = "is_fixed";
  local_60._flags = '\0';
  local_60._value = &local_2a9;
  ChArchiveIn::operator>>(marchive,&local_60);
  this->bflags = (uint)local_2a9 << 7 | this->bflags & 0xffffff7fU;
  local_78._name = "collide";
  local_78._flags = '\0';
  local_78._value = &local_2a9;
  ChArchiveIn::operator>>(marchive,&local_78);
  this->bflags = this->bflags & 0xfffffffeU | (uint)local_2a9;
  local_90._name = "limit_speed";
  local_90._flags = '\0';
  local_90._value = &local_2a9;
  ChArchiveIn::operator>>(marchive,&local_90);
  this->bflags = (uint)local_2a9 << 8 | this->bflags & 0xfffffeffU;
  local_a8._name = "no_gyro_torque";
  local_a8._flags = '\0';
  local_a8._value = &local_2a9;
  ChArchiveIn::operator>>(marchive,&local_a8);
  this->bflags = (uint)local_2a9 << 0xb | this->bflags & 0xfffff7ffU;
  local_c0._name = "use_sleeping";
  local_c0._flags = '\0';
  local_c0._value = &local_2a9;
  ChArchiveIn::operator>>(marchive,&local_c0);
  this->bflags = (uint)local_2a9 << 10 | this->bflags & 0xfffffbffU;
  local_d8._name = "is_sleeping";
  local_d8._flags = '\0';
  local_d8._value = &local_2a9;
  ChArchiveIn::operator>>(marchive,&local_d8);
  local_f0._value = &local_278;
  this->bflags = (uint)local_2a9 << 9 | this->bflags & 0xfffffdffU;
  local_278.
  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0._name = "markers";
  local_278.
  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_f0);
  local_108._value = &local_298;
  local_108._name = "forces";
  local_108._flags = '\0';
  local_280 = marchive;
  ChArchiveIn::operator>>(marchive,&local_108);
  RemoveAllMarkers(this);
  psVar3 = local_278.
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var4 = &(local_278.
                  super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != &psVar3->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_2a8,p_Var4)
    ;
    std::__shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_250,&local_2a8);
    AddMarker(this,(shared_ptr<chrono::ChMarker> *)&local_250);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
  }
  RemoveAllForces(this);
  psVar2 = local_298.
           super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var5 = &(local_298.
                  super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>;
      this_00 = local_280,
      p_Var5 != &psVar2->super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>;
      p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> *)&local_2a8,p_Var5);
    std::__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_260,(__shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2> *)&local_2a8);
    AddForce(this,(shared_ptr<chrono::ChForce> *)&local_260);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_refcount);
  }
  local_120._value = &this->body_id;
  local_120._name = "body_id";
  local_120._flags = '\0';
  ChArchiveIn::operator>>(local_280,&local_120);
  local_138._value = &this->collision_model;
  local_138._name = "collision_model";
  local_138._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_138);
  peVar1 = (this->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_ChCollisionModel[0x16])(peVar1,&this->super_ChContactable_1vars<6>);
  local_150._value = &this->gyro;
  local_150._name = "gyro";
  local_150._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_150);
  local_168._value = &this->Xforce;
  local_168._name = "Xforce";
  local_168._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_168);
  local_180._value = &this->Xtorque;
  local_180._name = "Xtorque";
  local_180._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_180);
  local_198._value = &this->density;
  local_198._name = "density";
  local_198._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_198);
  local_1b0._value = &this->variables;
  local_1b0._name = "variables";
  local_1b0._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_1b0);
  local_1c8._value = &this->max_speed;
  local_1c8._name = "max_speed";
  local_1c8._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_1c8);
  local_1e0._value = &this->max_wvel;
  local_1e0._name = "max_wvel";
  local_1e0._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_1e0);
  local_1f8._value = &this->sleep_time;
  local_1f8._name = "sleep_time";
  local_1f8._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_1f8);
  local_210._value = &this->sleep_minspeed;
  local_210._name = "sleep_minspeed";
  local_210._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_210);
  local_228._value = &this->sleep_minwvel;
  local_228._name = "sleep_minwvel";
  local_228._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_228);
  local_240._value = &this->sleep_starttime;
  local_240._name = "sleep_starttime";
  local_240._flags = '\0';
  ChArchiveIn::operator>>(this_00,&local_240);
  std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  ::~vector(&local_298);
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  ~vector(&local_278);
  return;
}

Assistant:

void ChBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChBody>();

    // deserialize parent class
    ChPhysicsItem::ArchiveIN(marchive);
    // deserialize parent class
    ChBodyFrame::ArchiveIN(marchive);

    // stream in all member data:

    marchive >> CHNVP(bflags);
    bool mflag;  // more readable flag output in case of ASCII in/out
    marchive >> CHNVP(mflag, "is_fixed");
    BFlagSet(BodyFlag::FIXED, mflag);
    marchive >> CHNVP(mflag, "collide");
    BFlagSet(BodyFlag::COLLIDE, mflag);
    marchive >> CHNVP(mflag, "limit_speed");
    BFlagSet(BodyFlag::LIMITSPEED, mflag);
    marchive >> CHNVP(mflag, "no_gyro_torque");
    BFlagSet(BodyFlag::NOGYROTORQUE, mflag);
    marchive >> CHNVP(mflag, "use_sleeping");
    BFlagSet(BodyFlag::USESLEEPING, mflag);
    marchive >> CHNVP(mflag, "is_sleeping");
    BFlagSet(BodyFlag::SLEEPING, mflag);

    std::vector<std::shared_ptr<ChMarker>> tempmarkers;
    std::vector<std::shared_ptr<ChForce>> tempforces;
    marchive >> CHNVP(tempmarkers, "markers");
    marchive >> CHNVP(tempforces, "forces");
    // trick needed because the "Add...() functions are required
    this->RemoveAllMarkers();
    for (auto i : tempmarkers) {
        this->AddMarker(i);
    }
    this->RemoveAllForces();
    for (auto i : tempforces) {
        this->AddForce(i);
    }

    marchive >> CHNVP(body_id);
    marchive >> CHNVP(collision_model);
    collision_model->SetContactable(this);
    marchive >> CHNVP(gyro);
    marchive >> CHNVP(Xforce);
    marchive >> CHNVP(Xtorque);
    // marchive << CHNVP(Force_acc); // not useful in serialization
    // marchive << CHNVP(Torque_acc);// not useful in serialization
    marchive >> CHNVP(density);
    marchive >> CHNVP(variables);
    marchive >> CHNVP(max_speed);
    marchive >> CHNVP(max_wvel);
    marchive >> CHNVP(sleep_time);
    marchive >> CHNVP(sleep_minspeed);
    marchive >> CHNVP(sleep_minwvel);
    marchive >> CHNVP(sleep_starttime);
}